

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O2

void aom_noise_tx_inverse(aom_noise_tx_t *noise_tx,float *data)

{
  int i;
  ulong uVar1;
  uint uVar2;
  
  uVar2 = noise_tx->block_size * noise_tx->block_size;
  (*noise_tx->ifft)(noise_tx->tx_block,noise_tx->temp,data);
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    data[uVar1] = data[uVar1] / (float)(int)uVar2;
  }
  return;
}

Assistant:

void aom_noise_tx_inverse(struct aom_noise_tx_t *noise_tx, float *data) {
  const int n = noise_tx->block_size * noise_tx->block_size;
  noise_tx->ifft(noise_tx->tx_block, noise_tx->temp, data);
  for (int i = 0; i < n; ++i) {
    data[i] /= n;
  }
}